

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

ssize_t __thiscall RunWriter::write(RunWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  char cVar2;
  ulong uVar3;
  
  uVar3 = ~this->prev + (ulong)(uint)__fd;
  while( true ) {
    this->out_bytes = this->out_bytes + 1;
    cVar2 = (char)this->out;
    if ((long)uVar3 < 0x80) break;
    std::ostream::put(cVar2);
    uVar3 = uVar3 >> 7;
  }
  sVar1 = std::ostream::put(cVar2);
  this->prev = (ulong)(uint)__fd;
  return sVar1;
}

Assistant:

void RunWriter::write(FileId next) {
    assert(next > prev);
    int64_t diff = (next - prev) - 1;
    while (diff >= 0x80U) {
        out_bytes++;
        out->put(static_cast<uint8_t>(0x80U | (diff & 0x7FU)));
        diff >>= 7;
    }
    out_bytes++;
    out->put(static_cast<uint8_t>(diff));
    prev = next;
}